

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O2

basic_bigint<std::allocator<unsigned_char>_> *
jsoncons::basic_bigint<std::allocator<unsigned_char>_>::from_string<wchar_t>
          (basic_bigint<std::allocator<unsigned_char>_> *__return_storage_ptr__,wchar_t *data,
          size_type length)

{
  uint uVar1;
  wchar_t wVar2;
  basic_bigint<std::allocator<unsigned_char>_> *this;
  runtime_error *this_00;
  long lVar3;
  allocator<char> local_129;
  basic_bigint<std::allocator<unsigned_char>_> *local_128;
  wchar_t local_11c;
  wchar_t *local_118;
  long local_110;
  basic_bigint<std::allocator<unsigned_char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  local_11c = *data;
  *(byte *)&__return_storage_ptr__->field_0 = *(byte *)&__return_storage_ptr__->field_0 & 0xfc;
  local_110 = length - (local_11c == L'-');
  local_118 = data + (local_11c == L'-');
  (__return_storage_ptr__->field_0).common_stor_.length_ = 0;
  (__return_storage_ptr__->field_0).short_stor_.values_[0] = 0;
  (__return_storage_ptr__->field_0).short_stor_.values_[1] = 0;
  lVar3 = 0;
  local_128 = __return_storage_ptr__;
  while( true ) {
    this = local_128;
    if (local_110 == lVar3) {
      if (local_11c == L'-') {
        *(byte *)&__return_storage_ptr__->field_0 = *(byte *)&__return_storage_ptr__->field_0 | 2;
      }
      return __return_storage_ptr__;
    }
    wVar2 = local_118[lVar3];
    uVar1 = wVar2 + L'\xffffffd0';
    if (9 < uVar1) break;
    basic_bigint(&local_80,local_128);
    operator*(&local_58,&local_80,10);
    jsoncons::operator+(&local_108,&local_58,(ulong)uVar1);
    operator=(this,&local_108);
    destroy(&local_108);
    destroy(&local_58);
    destroy(&local_80);
    lVar3 = lVar3 + 1;
    __return_storage_ptr__ = this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Invalid digit ",&local_129);
  std::operator+(&local_c0,&local_e0,"\'");
  std::operator+(&local_a0,&local_c0,(char)wVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 &local_a0,"\'");
  std::runtime_error::runtime_error(this_00,(string *)&local_108);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static basic_bigint<Allocator> from_string(const CharT* data, size_type length)
    {
        bool neg;
        if (*data == '-')
        {
            neg = true;
            data++;
            --length;
        }
        else
        {
            neg = false;
        }

        basic_bigint<Allocator> v = 0;
        for (size_type i = 0; i < length; i++)
        {
            CharT c = data[i];
            switch (c)
            {
                case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                    v = (v * 10u) + (uint64_t)(c - '0');
                    break;
                default:
                    JSONCONS_THROW(std::runtime_error(std::string("Invalid digit ") + "\'" + (char)c + "\'"));
            }
        }

        if (neg)
        {
            v.common_stor_.is_negative_ = true;
        }

        return v;
    }